

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O0

void __thiscall duckdb::SetCommentInfo::SetCommentInfo(SetCommentInfo *this)

{
  AlterInfo *in_RDI;
  AlterType in_stack_ffffffffffffffbf;
  AlterInfo *type;
  Value *in_stack_ffffffffffffffd0;
  LogicalTypeId in_stack_ffffffffffffffdf;
  LogicalType *in_stack_ffffffffffffffe0;
  
  AlterInfo::AlterInfo(in_RDI,in_stack_ffffffffffffffbf);
  (in_RDI->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__SetCommentInfo_0351aab0;
  type = in_RDI + 1;
  LogicalType::LogicalType(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  Value::Value(in_stack_ffffffffffffffd0,(LogicalType *)type);
  LogicalType::~LogicalType((LogicalType *)0xece865);
  return;
}

Assistant:

SetCommentInfo::SetCommentInfo() : AlterInfo(AlterType::SET_COMMENT) {
}